

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUseMangledMesaCommand.cxx
# Opt level: O2

bool cmUseMangledMesaCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *path_00;
  string *directory;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  pointer args_00;
  RegularExpression *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string inLine;
  string file;
  string dir;
  string tempOutputFile;
  string outFile;
  string path;
  string glh;
  string includeFile;
  string gfile;
  ifstream fin;
  byte abStack_688 [488];
  string e;
  ofstream fout;
  RegularExpression glDirLine;
  RegularExpression glLine;
  
  directory = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)directory == 0x40) {
    _fin = (pointer)directory->_M_string_length;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x5;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = anon_var_dwarf_1083c67;
    cmStrCat<>(&glh,(cmAlphaNum *)&fin,(cmAlphaNum *)&fout);
    bVar3 = cmsys::SystemTools::FileExists(&glh);
    if (bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fin,"\\.h$",(allocator<char> *)&fout);
      cmSystemTools::Glob(directory,(string *)&fin,&files);
      std::__cxx11::string::~string((string *)&fin);
      bVar3 = files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,
                       "Could not open Mesa Directory ",directory);
        cmSystemTools::Error((string *)&fin);
        std::__cxx11::string::~string((string *)&fin);
      }
      else {
        path_00 = pbVar1 + 1;
        cmsys::SystemTools::MakeDirectory(path_00,(mode_t *)0x0);
        pbVar2 = files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (args_00 = files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; args_00 != pbVar2;
            args_00 = args_00 + 1) {
          _fin = (pointer)directory->_M_string_length;
          fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)&DAT_00000001;
          fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
               &fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          fout.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0x2f;
          cmStrCat<std::__cxx11::string>(&path,(cmAlphaNum *)&fin,(cmAlphaNum *)&fout,args_00);
          dir._M_dataplus._M_p = (pointer)&dir.field_2;
          dir._M_string_length = 0;
          dir.field_2._M_local_buf[0] = '\0';
          file._M_dataplus._M_p = (pointer)&file.field_2;
          file._M_string_length = 0;
          file.field_2._M_local_buf[0] = '\0';
          cmsys::SystemTools::SplitProgramPath(&path,&dir,&file,true);
          _fin = (pointer)pbVar1[1]._M_string_length;
          fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)&DAT_00000001;
          fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
               &fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          fout.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0x2f;
          cmStrCat<std::__cxx11::string>(&outFile,(cmAlphaNum *)&fin,(cmAlphaNum *)&fout,&file);
          _fin = (pointer)outFile._M_string_length;
          fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)0x4;
          fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = (long)"%s.%s.tmp" + 5;
          cmStrCat<>(&tempOutputFile,(cmAlphaNum *)&fin,(cmAlphaNum *)&fout);
          std::ofstream::ofstream((cmAlphaNum *)&fout,tempOutputFile._M_dataplus._M_p,_S_out);
          if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
               [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                      [-3]] & 5) == 0) {
            std::ifstream::ifstream((cmAlphaNum *)&fin,path._M_dataplus._M_p,_S_in);
            if ((abStack_688[*(long *)(_fin + -0x18)] & 5) == 0) {
              inLine._M_dataplus._M_p = (pointer)&inLine.field_2;
              inLine._M_string_length = 0;
              inLine.field_2._M_local_buf[0] = '\0';
              cmsys::RegularExpression::RegularExpression
                        ((RegularExpression *)&e,"^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]");
              cmsys::RegularExpression::RegularExpression(&glDirLine,"(gl|GL)(/|\\\\)([^<\"]+)");
              cmsys::RegularExpression::RegularExpression(&glLine,"(gl|GL|xmesa)");
              while( true ) {
                bVar4 = cmsys::SystemTools::GetLineFromStream
                                  ((istream *)&fin,&inLine,(bool *)0x0,0xffffffffffffffff);
                if (!bVar4) break;
                bVar4 = cmsys::RegularExpression::find
                                  ((RegularExpression *)&e,inLine._M_dataplus._M_p);
                if (bVar4) {
                  cmsys::RegularExpressionMatch::match_abi_cxx11_
                            (&includeFile,(RegularExpressionMatch *)&e,1);
                  bVar4 = cmsys::RegularExpression::find(&glDirLine,includeFile._M_dataplus._M_p);
                  if (bVar4) {
                    cmsys::RegularExpressionMatch::match_abi_cxx11_(&gfile,&glDirLine.regmatch,3);
                    poVar5 = std::operator<<((ostream *)&fout,"#include \"");
                    poVar5 = std::operator<<(poVar5,(string *)path_00);
                    poVar5 = std::operator<<(poVar5,"/");
                    poVar5 = std::operator<<(poVar5,(string *)&gfile);
                    std::operator<<(poVar5,"\"\n");
LAB_00332ea2:
                    std::__cxx11::string::~string((string *)&gfile);
                  }
                  else {
                    bVar4 = cmsys::RegularExpression::find(&glLine,includeFile._M_dataplus._M_p);
                    if (bVar4) {
                      poVar5 = std::operator<<((ostream *)&fout,"#include \"");
                      poVar5 = std::operator<<(poVar5,(string *)path_00);
                      poVar5 = std::operator<<(poVar5,"/");
                      cmsys::RegularExpressionMatch::match_abi_cxx11_
                                (&gfile,(RegularExpressionMatch *)&e,1);
                      poVar5 = std::operator<<(poVar5,(string *)&gfile);
                      std::operator<<(poVar5,"\"\n");
                      goto LAB_00332ea2;
                    }
                    poVar5 = std::operator<<((ostream *)&fout,(string *)&inLine);
                    std::operator<<(poVar5,"\n");
                  }
                  std::__cxx11::string::~string((string *)&includeFile);
                }
                else {
                  poVar5 = std::operator<<((ostream *)&fout,(string *)&inLine);
                  std::operator<<(poVar5,"\n");
                }
              }
              std::ifstream::close();
              std::ofstream::close();
              cmSystemTools::MoveFileIfDifferent(&tempOutputFile,&outFile);
              cmsys::RegularExpression::~RegularExpression(&glLine);
              cmsys::RegularExpression::~RegularExpression(&glDirLine);
              cmsys::RegularExpression::~RegularExpression((RegularExpression *)&e);
              this = (RegularExpression *)&inLine;
            }
            else {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e
                             ,"Could not open file for read in copy operation",&path);
              cmSystemTools::Error(&e);
              this = (RegularExpression *)&e;
            }
            std::__cxx11::string::~string((string *)this);
            std::ifstream::~ifstream((cmAlphaNum *)&fin);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                           "Could not open file for write in copy operation: ",&tempOutputFile);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                           path_00);
            cmSystemTools::Error((string *)&fin);
            std::__cxx11::string::~string((string *)&fin);
            std::__cxx11::string::~string((string *)&e);
            cmSystemTools::ReportLastSystemError("");
          }
          std::ofstream::~ofstream((cmAlphaNum *)&fout);
          std::__cxx11::string::~string((string *)&tempOutputFile);
          std::__cxx11::string::~string((string *)&outFile);
          std::__cxx11::string::~string((string *)&file);
          std::__cxx11::string::~string((string *)&dir);
          std::__cxx11::string::~string((string *)&path);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&files);
    }
    else {
      _fin = (pointer)0x22;
      fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)glh._M_string_length;
      fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = glh._M_dataplus._M_p;
      glDirLine.regmatch.startp[0]._0_1_ = 0x20;
      cmStrCat<char>(&e,(cmAlphaNum *)&fin,(cmAlphaNum *)&fout,(char *)&glDirLine);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&e);
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&glh);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fin,"called with incorrect number of arguments",(allocator<char> *)&fout);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&fin);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmUseMangledMesaCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  // expected two arguments:
  // argument one: the full path to gl_mangle.h
  // argument two : directory for output of edited headers
  if (args.size() != 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  const std::string& inputDir = args[0];
  std::string glh = cmStrCat(inputDir, "/gl.h");
  if (!cmSystemTools::FileExists(glh)) {
    std::string e = cmStrCat("Bad path to Mesa, could not find: ", glh, ' ');
    status.SetError(e);
    return false;
  }
  const std::string& destDir = args[1];
  std::vector<std::string> files;
  cmSystemTools::Glob(inputDir, "\\.h$", files);
  if (files.empty()) {
    cmSystemTools::Error("Could not open Mesa Directory " + inputDir);
    return false;
  }
  cmSystemTools::MakeDirectory(destDir);
  for (std::string const& f : files) {
    std::string path = cmStrCat(inputDir, '/', f);
    CopyAndFullPathMesaHeader(path, destDir);
  }

  return true;
}